

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O1

void mpc_sbox_prove_s128_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,mzd_local_t *mask_a,
               mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  word128 r2m [3] [2];
  word128 r0m [3] [2];
  word128 x2m [3] [2];
  word128 r1m [3] [2];
  word128 r1s [3] [2];
  word128 r0s [3] [2];
  undefined1 auStack_308 [16];
  undefined1 auStack_2f8 [80];
  undefined1 auStack_2a8 [16];
  undefined1 auStack_298 [80];
  undefined1 auStack_248 [16];
  undefined1 auStack_238 [80];
  undefined1 auStack_1e8 [16];
  undefined1 auStack_1d8 [80];
  undefined1 auStack_188 [16];
  undefined1 auStack_178 [80];
  undefined1 auStack_128 [16];
  undefined1 auStack_118 [80];
  undefined1 auStack_c8 [16];
  undefined1 auStack_b8 [56];
  word128 x0s [3] [2];
  
  auVar8 = *(undefined1 (*) [16])mask_a->w64;
  auVar9 = *(undefined1 (*) [16])(mask_a->w64 + 2);
  auVar6 = *(undefined1 (*) [16])mask_b->w64;
  auVar7 = *(undefined1 (*) [16])(mask_b->w64 + 2);
  auVar10 = *(undefined1 (*) [16])mask_c->w64;
  auVar11 = *(undefined1 (*) [16])(mask_c->w64 + 2);
  lVar1 = 0;
  do {
    auVar5 = *(undefined1 (*) [16])((long)in->w64 + lVar1);
    auVar12 = *(undefined1 (*) [16])((long)in->w64 + lVar1 + 0x10);
    auVar13 = vpand_avx(auVar5,auVar8);
    *(undefined1 (*) [16])(auStack_308 + lVar1) = auVar13;
    auVar13 = vpand_avx(auVar12,auVar9);
    *(undefined1 (*) [16])(auStack_2f8 + lVar1) = auVar13;
    auVar13 = vpand_avx(auVar5,auVar6);
    *(undefined1 (*) [16])(auStack_2a8 + lVar1) = auVar13;
    auVar13 = vpand_avx(auVar12,auVar7);
    *(undefined1 (*) [16])(auStack_298 + lVar1) = auVar13;
    auVar5 = vpand_avx(auVar5,auVar10);
    *(undefined1 (*) [16])(auStack_188 + lVar1) = auVar5;
    auVar5 = vpand_avx(auVar12,auVar11);
    *(undefined1 (*) [16])(auStack_178 + lVar1) = auVar5;
    auVar5 = *(undefined1 (*) [16])(auStack_308 + lVar1);
    auVar12 = vpsrldq_avx(auVar5,8);
    auVar12 = vpsrlq_avx(auVar12,0x3e);
    auVar13 = vpslldq_avx(auVar5,8);
    auVar5 = vpshldq_avx512_vbmi2(auVar5,auVar13,2);
    *(undefined1 (*) [16])(auStack_308 + lVar1) = auVar5;
    auVar5 = vpslldq_avx(*(undefined1 (*) [16])(auStack_2f8 + lVar1),8);
    auVar5 = vpshldq_avx512_vbmi2(*(undefined1 (*) [16])(auStack_2f8 + lVar1),auVar5,2);
    auVar5 = vpor_avx(auVar5,auVar12);
    *(undefined1 (*) [16])(auStack_2f8 + lVar1) = auVar5;
    auVar5 = *(undefined1 (*) [16])(auStack_2a8 + lVar1);
    auVar12 = vpsrldq_avx(auVar5,8);
    auVar12 = vpsrlq_avx(auVar12,0x3f);
    auVar13 = vpslldq_avx(auVar5,8);
    auVar5 = vpshldq_avx512_vbmi2(auVar5,auVar13,1);
    *(undefined1 (*) [16])(auStack_2a8 + lVar1) = auVar5;
    auVar5 = vpslldq_avx(*(undefined1 (*) [16])(auStack_298 + lVar1),8);
    auVar5 = vpshldq_avx512_vbmi2(*(undefined1 (*) [16])(auStack_298 + lVar1),auVar5,1);
    auVar5 = vpor_avx(auVar5,auVar12);
    *(undefined1 (*) [16])(auStack_298 + lVar1) = auVar5;
    auVar5 = *(undefined1 (*) [16])((long)rvec + lVar1);
    auVar12 = *(undefined1 (*) [16])((long)rvec + lVar1 + 0x10);
    auVar13 = vpand_avx(auVar5,auVar8);
    *(undefined1 (*) [16])(auStack_1e8 + lVar1) = auVar13;
    auVar13 = vpand_avx(auVar12,auVar9);
    *(undefined1 (*) [16])(auStack_1d8 + lVar1) = auVar13;
    auVar13 = vpand_avx(auVar5,auVar6);
    *(undefined1 (*) [16])(auStack_128 + lVar1) = auVar13;
    auVar13 = vpand_avx(auVar12,auVar7);
    *(undefined1 (*) [16])(auStack_118 + lVar1) = auVar13;
    auVar5 = vpand_avx(auVar5,auVar10);
    *(undefined1 (*) [16])(auStack_248 + lVar1) = auVar5;
    auVar5 = vpand_avx(auVar12,auVar11);
    *(undefined1 (*) [16])(auStack_238 + lVar1) = auVar5;
    auVar5 = *(undefined1 (*) [16])(auStack_1e8 + lVar1);
    auVar12 = vpsrldq_avx(auVar5,8);
    auVar12 = vpsrlq_avx(auVar12,0x3e);
    auVar13 = vpslldq_avx(auVar5,8);
    auVar5 = vpshldq_avx512_vbmi2(auVar5,auVar13,2);
    *(undefined1 (*) [16])((long)x0s[0][1] + lVar1 + 8) = auVar5;
    auVar5 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1d8 + lVar1),8);
    auVar5 = vpshldq_avx512_vbmi2(*(undefined1 (*) [16])(auStack_1d8 + lVar1),auVar5,2);
    auVar5 = vpor_avx(auVar5,auVar12);
    *(undefined1 (*) [16])((long)x0s[1][0] + lVar1 + 8) = auVar5;
    auVar5 = *(undefined1 (*) [16])(auStack_128 + lVar1);
    auVar12 = vpsrldq_avx(auVar5,8);
    auVar12 = vpsrlq_avx(auVar12,0x3f);
    auVar13 = vpslldq_avx(auVar5,8);
    auVar5 = vpshldq_avx512_vbmi2(auVar5,auVar13,1);
    *(undefined1 (*) [16])(auStack_c8 + lVar1) = auVar5;
    auVar5 = vpslldq_avx(*(undefined1 (*) [16])(auStack_118 + lVar1),8);
    auVar5 = vpshldq_avx512_vbmi2(*(undefined1 (*) [16])(auStack_118 + lVar1),auVar5,1);
    auVar5 = vpor_avx(auVar5,auVar12);
    *(undefined1 (*) [16])(auStack_b8 + lVar1) = auVar5;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x60);
  lVar1 = 1;
  lVar2 = 0;
  do {
    lVar3 = 0;
    if (lVar2 != 0x40) {
      lVar3 = lVar1;
    }
    lVar3 = lVar3 * 0x20;
    auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_308 + lVar3),
                                 *(undefined1 (*) [16])(auStack_308 + lVar2),
                                 *(undefined1 (*) [16])(auStack_2a8 + lVar2),0x28);
    auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_2f8 + lVar3),
                                 *(undefined1 (*) [16])(auStack_2f8 + lVar2),
                                 *(undefined1 (*) [16])(auStack_298 + lVar2),0x28);
    auVar8 = vpand_avx(*(undefined1 (*) [16])(auStack_308 + lVar2),
                       *(undefined1 (*) [16])(auStack_2a8 + lVar3));
    auVar9 = vpand_avx(*(undefined1 (*) [16])(auStack_2f8 + lVar2),
                       *(undefined1 (*) [16])(auStack_298 + lVar3));
    auVar8 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_248 + lVar2) ^
                                 *(undefined1 (*) [16])(auStack_248 + lVar3),auVar8,auVar6,0x96);
    *(undefined1 (*) [16])(auStack_1e8 + lVar2) = auVar8;
    auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_238 + lVar2) ^
                                 *(undefined1 (*) [16])(auStack_238 + lVar3),auVar9,auVar7,0x96);
    *(undefined1 (*) [16])(auStack_1d8 + lVar2) = auVar9;
    *(undefined1 (*) [16])((long)view + lVar2) = auVar8;
    *(undefined1 (*) [16])((long)view + lVar2 + 0x10) = auVar9;
    lVar2 = lVar2 + 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar2 != 0x60);
  lVar1 = 1;
  lVar2 = 0;
  do {
    lVar3 = 0;
    if (lVar2 != 0x40) {
      lVar3 = lVar1;
    }
    lVar4 = lVar3 * 0x20;
    auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_2a8 + lVar4),
                                 *(undefined1 (*) [16])(auStack_2a8 + lVar2),
                                 *(undefined1 (*) [16])(auStack_188 + lVar2),0x28);
    auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_298 + lVar4),
                                 *(undefined1 (*) [16])(auStack_298 + lVar2),
                                 *(undefined1 (*) [16])(auStack_178 + lVar2),0x28);
    auVar8 = vpand_avx(*(undefined1 (*) [16])(auStack_2a8 + lVar2),
                       *(undefined1 (*) [16])(auStack_188 + lVar4));
    auVar9 = vpand_avx(*(undefined1 (*) [16])(auStack_298 + lVar2),
                       *(undefined1 (*) [16])(auStack_178 + lVar4));
    auVar8 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_c8 + lVar2) ^
                                 *(undefined1 (*) [16])(auStack_c8 + lVar4),auVar8,auVar6,0x96);
    *(undefined1 (*) [16])(auStack_248 + lVar2) = auVar8;
    auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_b8 + lVar2) ^
                                 *(undefined1 (*) [16])(x0s[lVar3 + -2][0] + 1),auVar9,auVar7,0x96);
    *(undefined1 (*) [16])(auStack_238 + lVar2) = auVar9;
    auVar6 = vpslldq_avx(auVar9,8);
    auVar6 = vpsllq_avx(auVar6,0x3f);
    auVar7 = vpsrldq_avx(auVar8,8);
    auVar8 = vpshldq_avx512_vbmi2(auVar7,auVar8,0x3f);
    auVar7 = vpsrldq_avx(auVar9,8);
    auVar9 = vpshldq_avx512_vbmi2(auVar7,auVar9,0x3f);
    auVar8 = vpternlogq_avx512vl(auVar8,auVar6,*(undefined1 (*) [16])((long)view + lVar2),0x56);
    *(undefined1 (*) [16])((long)view + lVar2) = auVar8;
    *(undefined1 (*) [16])((long)view + lVar2 + 0x10) =
         auVar9 ^ *(undefined1 (*) [16])((long)view + lVar2 + 0x10);
    lVar2 = lVar2 + 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar2 != 0x60);
  lVar1 = 1;
  lVar2 = 0;
  do {
    lVar3 = 0;
    if (lVar2 != 0x40) {
      lVar3 = lVar1;
    }
    lVar4 = lVar3 * 0x20;
    auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_308 + lVar4),
                                 *(undefined1 (*) [16])(auStack_308 + lVar2),
                                 *(undefined1 (*) [16])(auStack_188 + lVar2),0x28);
    auVar10 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_2f8 + lVar4),
                                  *(undefined1 (*) [16])(auStack_2f8 + lVar2),
                                  *(undefined1 (*) [16])(auStack_178 + lVar2),0x28);
    auVar9 = vpand_avx(*(undefined1 (*) [16])(auStack_308 + lVar2),
                       *(undefined1 (*) [16])(auStack_188 + lVar4));
    auVar6 = vpand_avx(*(undefined1 (*) [16])(auStack_2f8 + lVar2),
                       *(undefined1 (*) [16])(auStack_178 + lVar4));
    auVar8 = *(undefined1 (*) [16])((long)x0s[1][0] + lVar2 + 8);
    auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)x0s[0][1] + lVar2 + 8) ^
                                 *(undefined1 (*) [16])(x0s[lVar3][1] + 1),auVar9,auVar7,0x96);
    *(undefined1 (*) [16])(auStack_128 + lVar2) = auVar9;
    auVar8 = vpternlogq_avx512vl(auVar8 ^ *(undefined1 (*) [16])(x0s[lVar3 + 1][0] + 1),auVar6,
                                 auVar10,0x96);
    *(undefined1 (*) [16])(auStack_118 + lVar2) = auVar8;
    auVar6 = vpslldq_avx(auVar8,8);
    auVar6 = vpsllq_avx(auVar6,0x3e);
    auVar7 = vpsrldq_avx(auVar9,8);
    auVar9 = vpshldq_avx512_vbmi2(auVar7,auVar9,0x3e);
    auVar7 = vpsrldq_avx(auVar8,8);
    auVar8 = vpshldq_avx512_vbmi2(auVar7,auVar8,0x3e);
    auVar9 = vpternlogq_avx512vl(auVar9,auVar6,*(undefined1 (*) [16])((long)view + lVar2),0x56);
    *(undefined1 (*) [16])((long)view + lVar2) = auVar9;
    *(undefined1 (*) [16])((long)view + lVar2 + 0x10) =
         auVar8 ^ *(undefined1 (*) [16])((long)view + lVar2 + 0x10);
    lVar2 = lVar2 + 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar2 != 0x60);
  lVar1 = 0;
  do {
    *(undefined1 (*) [16])(auStack_248 + lVar1) =
         *(undefined1 (*) [16])(auStack_308 + lVar1) ^ *(undefined1 (*) [16])(auStack_248 + lVar1);
    *(undefined1 (*) [16])(auStack_238 + lVar1) =
         *(undefined1 (*) [16])(auStack_2f8 + lVar1) ^ *(undefined1 (*) [16])(auStack_238 + lVar1);
    auVar7 = *(undefined1 (*) [16])(auStack_308 + lVar1) ^
             *(undefined1 (*) [16])(auStack_2a8 + lVar1);
    *(undefined1 (*) [16])(auStack_308 + lVar1) = auVar7;
    auVar10 = *(undefined1 (*) [16])(auStack_2f8 + lVar1) ^
              *(undefined1 (*) [16])(auStack_298 + lVar1);
    *(undefined1 (*) [16])(auStack_2f8 + lVar1) = auVar10;
    *(undefined1 (*) [16])(auStack_128 + lVar1) =
         auVar7 ^ *(undefined1 (*) [16])(auStack_128 + lVar1);
    auVar8 = *(undefined1 (*) [16])(auStack_118 + lVar1);
    *(undefined1 (*) [16])(auStack_118 + lVar1) = auVar10 ^ auVar8;
    auVar9 = *(undefined1 (*) [16])(auStack_1e8 + lVar1);
    *(undefined1 (*) [16])(auStack_1e8 + lVar1) = auVar7 ^ auVar9;
    auVar6 = *(undefined1 (*) [16])(auStack_1d8 + lVar1);
    *(undefined1 (*) [16])(auStack_1d8 + lVar1) = auVar10 ^ auVar6;
    auVar7 = auVar7 ^ auVar9 ^ *(undefined1 (*) [16])(auStack_188 + lVar1);
    *(undefined1 (*) [16])(auStack_1e8 + lVar1) = auVar7;
    auVar6 = auVar10 ^ auVar6 ^ *(undefined1 (*) [16])(auStack_178 + lVar1);
    *(undefined1 (*) [16])(auStack_1d8 + lVar1) = auVar6;
    auVar9 = vpslldq_avx(*(undefined1 (*) [16])(auStack_238 + lVar1),8);
    auVar5 = vpsllq_avx(auVar9,0x3e);
    auVar9 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_248 + lVar1),8);
    auVar9 = vpshldq_avx512_vbmi2(auVar9,*(undefined1 (*) [16])(auStack_248 + lVar1),0x3e);
    *(undefined1 (*) [16])(auStack_308 + lVar1) = auVar9;
    auVar11 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_238 + lVar1),8);
    auVar11 = vpshldq_avx512_vbmi2(auVar11,*(undefined1 (*) [16])(auStack_238 + lVar1),0x3e);
    *(undefined1 (*) [16])(auStack_2f8 + lVar1) = auVar11;
    auVar9 = vpor_avx(auVar9,auVar5);
    *(undefined1 (*) [16])(auStack_308 + lVar1) = auVar9;
    auVar5 = vpslldq_avx(*(undefined1 (*) [16])(auStack_118 + lVar1),8);
    auVar13 = vpsllq_avx(auVar5,0x3f);
    auVar5 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_128 + lVar1),8);
    auVar5 = vpshldq_avx512_vbmi2(auVar5,*(undefined1 (*) [16])(auStack_128 + lVar1),0x3f);
    *(undefined1 (*) [16])(auStack_2a8 + lVar1) = auVar5;
    auVar12 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_118 + lVar1),8);
    auVar10 = vpshldq_avx512_vbmi2(auVar12,auVar10 ^ auVar8,0x3f);
    *(undefined1 (*) [16])(auStack_298 + lVar1) = auVar10;
    auVar8 = vpor_avx(auVar5,auVar13);
    *(undefined1 (*) [16])(auStack_2a8 + lVar1) = auVar8;
    *(undefined1 (*) [16])(auStack_308 + lVar1) = auVar8 ^ auVar9;
    *(undefined1 (*) [16])(auStack_2f8 + lVar1) = auVar10 ^ auVar11;
    auVar7 = auVar8 ^ auVar9 ^ auVar7;
    *(undefined1 (*) [16])(auStack_1e8 + lVar1) = auVar7;
    auVar6 = auVar10 ^ auVar11 ^ auVar6;
    *(undefined1 (*) [16])(auStack_1d8 + lVar1) = auVar6;
    *(undefined1 (*) [16])((long)out->w64 + lVar1) = auVar7;
    *(undefined1 (*) [16])((long)out->w64 + lVar1 + 0x10) = auVar6;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x60);
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mpc_sbox_prove_s128_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                           const rvec_t* rvec, const mzd_local_t* mask_a,
                                           const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  bitsliced_mm128_256_step_1(SC_PROOF, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm128_256_and_def(NROLR, r0m, x0s, x1s, r2m, 0);
  // b & c
  mpc_mm128_256_and_def(mm128_shift_right_256, r2m, x1s, x2m, r1s, 1);
  // c & a
  mpc_mm128_256_and_def(mm128_shift_right_256, r1m, x0s, x2m, r0s, 2);

  bitsliced_mm128_256_step_2(SC_PROOF);
}